

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

ostream * operator<<(ostream *os,CuttingPlane *vv)

{
  ostream *poVar1;
  double dVar2;
  
  std::operator<<(os,"plane{\n");
  poVar1 = std::ostream::_M_insert<double>((vv->normal).x);
  std::operator<<(poVar1,"*x");
  dVar2 = (vv->normal).y;
  if (0.0 <= dVar2) {
    std::operator<<(os,"+");
    dVar2 = (vv->normal).y;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,"*y");
  dVar2 = (vv->normal).z;
  if (0.0 <= dVar2) {
    std::operator<<(os,"+");
    dVar2 = (vv->normal).z;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,"*z");
  std::operator<<(os,",");
  poVar1 = std::ostream::_M_insert<double>(vv->start_distance);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"}\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const CuttingPlane& vv)
{
  os << "plane{\n";
  os << vv.normal.x << "*x";
  if (vv.normal.y >= 0)
  {
    os << "+";
  }
  os << vv.normal.y << "*y";
  if (vv.normal.z >= 0)
  {
    os << "+";
  }
  os << vv.normal.z << "*z";

  os << ",";

  os << vv.start_distance << "\n";
  os << "}\n";
  return os;
}